

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O1

void __thiscall vector_bagwell<int,_16U>::push_back(vector_bagwell<int,_16U> *this,int *t)

{
  int iVar1;
  int *piVar2;
  
  if (this->_left_in_block == 0) {
    vector_bagwell<int,16u>::push_back();
  }
  iVar1 = *t;
  piVar2 = this->_insertpos;
  this->_insertpos = piVar2 + 1;
  *piVar2 = iVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(current_block_full(), false)) {
			_left_in_block = Initial << _index_block.size();
			_insertpos = static_cast<T*>(
					malloc(_left_in_block*sizeof(T)));
			_index_block.push_back(_insertpos);
		}
		*_insertpos++ = t;
		--_left_in_block;
	}